

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRReader.cpp
# Opt level: O0

Barcode * __thiscall ZXing::QRCode::Reader::decode(Reader *this,BinaryBitmap *image)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  BitMatrix *pBVar4;
  undefined8 in_RDX;
  long *in_RSI;
  Barcode *in_RDI;
  BitMatrix *in_stack_00000018;
  BitMatrix *in_stack_00000028;
  BarcodeFormat format;
  DecoderResult decoderResult;
  DetectorResult detectorResult;
  BitMatrix *binImg;
  DetectorResult *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  ReaderOptions *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  BarcodeFormats in_stack_fffffffffffffd44;
  Result *in_stack_fffffffffffffd70;
  BarcodeFormat in_stack_fffffffffffffdec;
  DetectorResult *in_stack_fffffffffffffdf0;
  DecoderResult *in_stack_fffffffffffffdf8;
  Result *in_stack_fffffffffffffe00;
  BitMatrix *in_stack_fffffffffffffe78;
  Flags<ZXing::BarcodeFormat> local_11c [18];
  Flags<ZXing::BarcodeFormat> local_d4 [18];
  Flags<ZXing::BarcodeFormat> local_8c;
  DetectorResult local_88;
  BitMatrix *local_48;
  undefined1 local_30 [24];
  undefined8 local_18;
  
  local_18 = in_RDX;
  bVar1 = ReaderOptions::isPure((ReaderOptions *)in_RSI[1]);
  if (bVar1) {
    local_48 = BinaryBitmap::getBitMatrix
                         ((BinaryBitmap *)
                          CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    if (local_48 == (BitMatrix *)0x0) {
      memset(in_RDI,0,0xd8);
      Result::Result(in_stack_fffffffffffffd70);
    }
    else {
      DetectorResult::DetectorResult
                ((DetectorResult *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      Flags<ZXing::BarcodeFormat>::Flags(&local_8c,QRCode);
      bVar1 = ReaderOptions::hasFormat(in_stack_fffffffffffffd38,in_stack_fffffffffffffd44);
      if (bVar1) {
        DetectPureQR(in_stack_00000018);
        DetectorResult::operator=
                  ((DetectorResult *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   in_stack_fffffffffffffd28);
        DetectorResult::~DetectorResult((DetectorResult *)0x2fcfbc);
      }
      Flags<ZXing::BarcodeFormat>::Flags(local_d4,MicroQRCode);
      bVar1 = ReaderOptions::hasFormat(in_stack_fffffffffffffd38,in_stack_fffffffffffffd44);
      if ((bVar1) && (bVar1 = DetectorResult::isValid((DetectorResult *)0x2fd01e), !bVar1)) {
        DetectPureMQR(in_stack_fffffffffffffe78);
        DetectorResult::operator=
                  ((DetectorResult *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   in_stack_fffffffffffffd28);
        DetectorResult::~DetectorResult((DetectorResult *)0x2fd067);
      }
      Flags<ZXing::BarcodeFormat>::Flags(local_11c,RMQRCode);
      bVar1 = ReaderOptions::hasFormat(in_stack_fffffffffffffd38,in_stack_fffffffffffffd44);
      if ((bVar1) && (bVar1 = DetectorResult::isValid((DetectorResult *)0x2fd0ae), !bVar1)) {
        DetectPureRMQR(in_stack_00000028);
        DetectorResult::operator=
                  ((DetectorResult *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   in_stack_fffffffffffffd28);
        DetectorResult::~DetectorResult((DetectorResult *)0x2fd0f7);
      }
      bVar1 = DetectorResult::isValid((DetectorResult *)0x2fd104);
      if (bVar1) {
        DetectorResult::bits(&local_88);
        Decode((BitMatrix *)decoderResult._error._msg._M_string_length);
        pBVar4 = DetectorResult::bits(&local_88);
        iVar2 = BitMatrix::width(pBVar4);
        pBVar4 = DetectorResult::bits(&local_88);
        iVar3 = BitMatrix::height(pBVar4);
        if (iVar2 == iVar3) {
          pBVar4 = DetectorResult::bits(&local_88);
          in_stack_fffffffffffffd34 = BitMatrix::width(pBVar4);
        }
        Result::Result(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0
                       ,in_stack_fffffffffffffdec);
        DecoderResult::~DecoderResult
                  ((DecoderResult *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      }
      else {
        in_RDI->_format = None;
        in_RDI->_ecLevel[0] = '\0';
        in_RDI->_ecLevel[1] = '\0';
        in_RDI->_ecLevel[2] = '\0';
        in_RDI->_ecLevel[3] = '\0';
        in_RDI->_version[0] = '\0';
        in_RDI->_version[1] = '\0';
        in_RDI->_version[2] = '\0';
        in_RDI->_version[3] = '\0';
        in_RDI->_lineCount = 0;
        (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
        *(undefined8 *)&(in_RDI->_sai).id = 0;
        (in_RDI->_sai).id._M_string_length = 0;
        *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
        (in_RDI->_sai).index = 0;
        (in_RDI->_sai).count = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
        *(undefined8 *)&in_RDI->_readerOpts = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
        (in_RDI->_error)._line = 0;
        (in_RDI->_error)._type = None;
        *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
        *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
        (in_RDI->_error)._file = (char *)0x0;
        (in_RDI->_error)._msg._M_string_length = 0;
        (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
        (in_RDI->_content).symbology.code = '\0';
        (in_RDI->_content).symbology.modifier = '\0';
        (in_RDI->_content).symbology.eciModifierOffset = '\0';
        (in_RDI->_content).symbology.aiFlag = None;
        (in_RDI->_content).defaultCharset = Unknown;
        (in_RDI->_content).hasECI = false;
        *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
        *(undefined8 *)&(in_RDI->_error)._msg = 0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        in_RDI->_isMirrored = false;
        in_RDI->_isInverted = false;
        in_RDI->_readerInit = false;
        *(undefined5 *)&in_RDI->field_0xd3 = 0;
        Result::Result((Result *)0x0);
      }
      DetectorResult::~DetectorResult((DetectorResult *)0x2fd2c6);
    }
  }
  else {
    (**(code **)(*in_RSI + 0x18))(local_30,in_RSI,local_18,1);
    FirstOrDefault<std::vector,_ZXing::Result,_std::allocator<ZXing::Result>_>
              ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)in_stack_fffffffffffffd38);
    std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
              ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
               CONCAT44(in_stack_fffffffffffffd44.i,in_stack_fffffffffffffd40));
  }
  return in_RDI;
}

Assistant:

Barcode Reader::decode(const BinaryBitmap& image) const
{
#if 1
	if (!_opts.isPure())
		return FirstOrDefault(decode(image, 1));
#endif

	auto binImg = image.getBitMatrix();
	if (binImg == nullptr)
		return {};

	DetectorResult detectorResult;
	if (_opts.hasFormat(BarcodeFormat::QRCode))
		detectorResult = DetectPureQR(*binImg);
	if (_opts.hasFormat(BarcodeFormat::MicroQRCode) && !detectorResult.isValid())
		detectorResult = DetectPureMQR(*binImg);
	if (_opts.hasFormat(BarcodeFormat::RMQRCode) && !detectorResult.isValid())
		detectorResult = DetectPureRMQR(*binImg);

	if (!detectorResult.isValid())
		return {};

	auto decoderResult = Decode(detectorResult.bits());
	auto format = detectorResult.bits().width() != detectorResult.bits().height() ? BarcodeFormat::RMQRCode
				  : detectorResult.bits().width() < 21                            ? BarcodeFormat::MicroQRCode
																				  : BarcodeFormat::QRCode;

	return Barcode(std::move(decoderResult), std::move(detectorResult), format);
}